

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_solver.cpp
# Opt level: O1

vector<Item_*,_std::allocator<Item_*>_> * __thiscall
WorldSolver::missing_items_to_take_path
          (vector<Item_*,_std::allocator<Item_*>_> *__return_storage_ptr__,WorldSolver *this,
          WorldPath *path)

{
  Item **__src;
  pointer ppIVar1;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> __dest;
  pointer ppIVar2;
  vector<Item_*,_std::allocator<Item_*>_> inventory_copy;
  Item *item;
  vector<Item_*,_std::allocator<Item_*>_> local_40;
  Item *local_28;
  
  std::vector<Item_*,_std::allocator<Item_*>_>::vector(&local_40,&this->_inventory);
  (__return_storage_ptr__->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Item_*,_std::allocator<Item_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppIVar2 = (path->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar1 = (path->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar2 != ppIVar1) {
    do {
      local_28 = *ppIVar2;
      __dest = std::
               __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                         (local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_finish,&local_28);
      if (__dest._M_current ==
          local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                  ((vector<Item*,std::allocator<Item*>> *)__return_storage_ptr__,&local_28);
      }
      else {
        __src = __dest._M_current + 1;
        if (__src != local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                     super__Vector_impl_data._M_finish) {
          memmove(__dest._M_current,__src,
                  (long)local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)__src);
        }
        local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + -1;
      }
      ppIVar2 = ppIVar2 + 1;
    } while (ppIVar2 != ppIVar1);
  }
  if (local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Item*> WorldSolver::missing_items_to_take_path(WorldPath* path) const
{
    const std::vector<Item*>& required_items = path->required_items();
    std::vector<Item*> inventory_copy = _inventory;

    std::vector<Item*> missing_items;
    for (Item* item : required_items)
    {
        auto it = std::find(inventory_copy.begin(), inventory_copy.end(), item);

        // Item could not be found in inventory, path cannot be taken
        if (it == inventory_copy.end())
        {
            missing_items.emplace_back(item);
        }
        else
        {
            // Item has been found, remove it from the inventory copy for it not to count several times
            // (case where quantity needed is > 1)
            inventory_copy.erase(it);
        }
    }

    return missing_items;
}